

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

void StringFormatter<char_const*,std::__cxx11::string>::
     format<char_const*const,std::__cxx11::string_const&>
               (ostream *os,char *fmt,char **value,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  char **value_01;
  long lVar5;
  void *pvVar6;
  runtime_error *this;
  bool bVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  char *__nptr;
  char *q;
  ostream local_6c;
  char local_6a;
  char local_69;
  undefined8 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  long local_58;
  char *local_50;
  char **local_48;
  long local_40;
  char *local_38;
  
  local_48 = value;
  while( true ) {
    for (; cVar2 = *fmt, cVar2 != '%'; fmt = fmt + 1) {
      if (cVar2 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_69 = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_69,1);
    }
    cVar2 = fmt[1];
    if (cVar2 != '%') break;
    fmt = fmt + 2;
    local_6a = '%';
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_6a,1);
  }
  pcVar9 = fmt + (cVar2 == '-');
  cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
  bVar7 = cVar3 == ' ' || cVar3 == '+';
  __nptr = pcVar9 + (ulong)bVar7 + 1;
  if (*__nptr == ',') {
    __nptr = pcVar9 + (ulong)bVar7 + 2;
    local_6c = (ostream)0x2c;
  }
  else if (*__nptr == '0') {
    __nptr = pcVar9 + (ulong)bVar7 + 2;
    local_6c = (ostream)0x30;
  }
  else {
    local_6c = (ostream)0x20;
  }
  local_40 = strtol(__nptr,&local_38,10);
  local_50 = local_38;
  local_60 = args;
  if (*local_38 == '.') {
    pcVar10 = local_38 + 1;
    lVar5 = strtol(pcVar10,&local_38,10);
    local_68 = CONCAT71((int7)((ulong)pcVar9 >> 8),pcVar10 != local_38);
    local_58 = (long)(int)lVar5;
  }
  else {
    local_58 = 0;
    local_68 = 0;
  }
  do {
    pcVar9 = local_38;
    cVar4 = *pcVar9;
    pvVar6 = memchr("qhlLzjt",(int)cVar4,8);
    value_00 = local_60;
    local_38 = pcVar9 + 1;
  } while (pvVar6 != (void *)0x0);
  pcVar10 = pcVar9;
  if ((cVar4 == 'I') && (pcVar10 = pcVar9 + 1, (byte)(pcVar9[2] | 2U) == 0x36)) {
    pcVar10 = pcVar9 + 3;
  }
  cVar4 = *pcVar10;
  StringFormatter<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::applytype(os,cVar4);
  value_01 = local_48;
  lVar5 = *(long *)os;
  if (cVar3 == '+') {
    os[*(long *)(lVar5 + -0x18) + 0x19] = (ostream)((byte)os[*(long *)(lVar5 + -0x18) + 0x19] | 8);
    uVar8 = 0x10;
    if (cVar2 == '-') {
LAB_0011085d:
      uVar8 = 0x20;
    }
    *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | uVar8;
  }
  else {
    os[*(long *)(lVar5 + -0x18) + 0x19] =
         (ostream)((byte)os[*(long *)(lVar5 + -0x18) + 0x19] & 0xf7);
    if (cVar2 == '-') goto LAB_0011085d;
  }
  if (__nptr == local_50) {
    *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 0x10) = 0;
  }
  else {
    *(long *)(os + *(long *)(lVar5 + -0x18) + 0x10) = (long)(int)local_40;
    if (cVar2 != '-' && cVar3 != '+') {
      *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    }
  }
  if ((char)local_68 != '\0') {
    *(long *)(os + *(long *)(lVar5 + -0x18) + 8) = local_58;
  }
  poVar1 = os + *(long *)(lVar5 + -0x18);
  if (os[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = local_6c;
  if (cVar4 == 's') {
    if (*value_01 != (char *)0x0) goto LAB_00110931;
    pcVar9 = "(null)";
    lVar5 = 6;
  }
  else {
    if (cVar4 == 'p') {
      std::ostream::_M_insert<void_const*>(os);
      goto LAB_00110962;
    }
LAB_00110931:
    bVar7 = output_using_operator<char_const*>(os,value_01);
    if (bVar7) goto LAB_00110962;
    pcVar9 = "<?>";
    lVar5 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,lVar5);
LAB_00110962:
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
  format<std::__cxx11::string_const>(os,pcVar10 + (cVar4 != '\0'),value_00);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }